

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spikeestimator.cxx
# Opt level: O3

Matrix * __thiscall
SpikeEstimator::getEstimate(Matrix *__return_storage_ptr__,SpikeEstimator *this,Property *what)

{
  uint uVar1;
  pointer pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  size_type *psVar7;
  ulong uVar8;
  double d;
  long *local_1d8;
  undefined8 local_1d0;
  long local_1c8;
  undefined8 uStack_1c0;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  ulong *local_198;
  long local_190;
  ulong local_188 [2];
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  double local_158;
  long *local_150 [2];
  long local_140 [2];
  undefined1 local_130 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_118 [14];
  
  if (*what != 4) {
    if (*what == 1) {
      getSample(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    Matrix::Matrix(__return_storage_ptr__,0);
    local_130._0_8_ = local_130 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"Property not implemented","");
    Matrix::setName(__return_storage_ptr__,(string *)local_130);
    if ((undefined1 *)local_130._0_8_ == local_130 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
    return __return_storage_ptr__;
  }
  Matrix::Matrix(__return_storage_ptr__,1);
  pcVar2 = (this->spkA->super_StochasticVariable).super_StochasticProcess.super_Parametric.
           parametricName._M_dataplus._M_p;
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_150,pcVar2,
             pcVar2 + (this->spkA->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric.parametricName._M_string_length);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_150,0,(char *)0x0,0x14d40f);
  local_178 = &local_168;
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_168 = *plVar5;
    lStack_160 = plVar3[3];
  }
  else {
    local_168 = *plVar5;
    local_178 = (long *)*plVar3;
  }
  local_170 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_178);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_1a8 = *puVar6;
    uStack_1a0 = (undefined4)plVar3[3];
    uStack_19c = *(undefined4 *)((long)plVar3 + 0x1c);
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *puVar6;
    local_1b8 = (ulong *)*plVar3;
  }
  local_1b0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  pcVar2 = (this->spkB->super_StochasticVariable).super_StochasticProcess.super_Parametric.
           parametricName._M_dataplus._M_p;
  local_198 = local_188;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar2,
             pcVar2 + (this->spkB->super_StochasticVariable).super_StochasticProcess.
                      super_Parametric.parametricName._M_string_length);
  uVar8 = 0xf;
  if (local_1b8 != &local_1a8) {
    uVar8 = local_1a8;
  }
  if (uVar8 < (ulong)(local_190 + local_1b0)) {
    uVar8 = 0xf;
    if (local_198 != local_188) {
      uVar8 = local_188[0];
    }
    if ((ulong)(local_190 + local_1b0) <= uVar8) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,(ulong)local_1b8);
      goto LAB_001468f3;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_198);
LAB_001468f3:
  local_1d8 = &local_1c8;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_1c8 = *plVar3;
    uStack_1c0 = puVar4[3];
  }
  else {
    local_1c8 = *plVar3;
    local_1d8 = (long *)*puVar4;
  }
  local_1d0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar7) {
    local_130._16_8_ = *psVar7;
    aaStack_118[0]._0_8_ = plVar3[3];
    local_130._0_8_ = local_130 + 0x10;
  }
  else {
    local_130._16_8_ = *psVar7;
    local_130._0_8_ = (size_type *)*plVar3;
  }
  local_130._8_8_ = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  Matrix::setName(__return_storage_ptr__,(string *)local_130);
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  if (local_1d8 != &local_1c8) {
    operator_delete(local_1d8,local_1c8 + 1);
  }
  if (local_198 != local_188) {
    operator_delete(local_198,local_188[0] + 1);
  }
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178,local_168 + 1);
  }
  if (local_150[0] != local_140) {
    operator_delete(local_150[0],local_140[0] + 1);
  }
  uVar1 = (this->super_Estimator).nSamples;
  local_158 = this->spkOne;
  Matrix::operator[]((Matrix *)local_130,__return_storage_ptr__,0);
  if (uVar1 == 0) {
    d = 1.0;
  }
  else {
    d = local_158 / (double)uVar1;
  }
  Matrix::operator=((Matrix *)local_130,d);
  Matrix::~Matrix((Matrix *)local_130);
  return __return_storage_ptr__;
}

Assistant:

Matrix SpikeEstimator::getEstimate(const Property& what)
{
    if (what==EST_SAMPLE)
        return getSample();
    else if (what==EST_MEAN) {
        Matrix a{1};
        a.setName("1/T * integral( O-SPIKE " + spkA->getName() + " - " + spkB->getName() + ") dt");
        a[0] = getMean();
        return a;
    }
    else {
        Matrix a{0};
        a.setName("Property not implemented");
        return a;
    }
}